

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O1

void __thiscall echo_server::echo_server(echo_server *this,epoll *ep,ipv4_endpoint *param_2)

{
  _Rb_tree_header *p_Var1;
  ipv4_endpoint iVar2;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  this->ep = ep;
  iVar2 = *param_2;
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(code **)local_48._M_unused._0_8_ = on_new_connection;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
  *(echo_server **)((long)local_48._M_unused._0_8_ + 0x10) = this;
  pcStack_30 = std::_Function_handler<void_(),_std::_Bind<void_(echo_server::*(echo_server_*))()>_>
               ::_M_invoke;
  local_38 = std::_Function_handler<void_(),_std::_Bind<void_(echo_server::*(echo_server_*))()>_>::
             _M_manager;
  server_socket::server_socket(&this->ss,ep,iVar2,(on_connected_t *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  p_Var1 = &(this->connections)._M_t._M_impl.super__Rb_tree_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

echo_server::echo_server(epoll &ep, ipv4_endpoint const& local_endpoint)
    : ep(ep)
    , ss{ep, local_endpoint, std::bind(&echo_server::on_new_connection, this)}
{}